

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O3

vector<candidate_variant,_std::allocator<candidate_variant>_> *
find_variants(vector<candidate_variant,_std::allocator<candidate_variant>_> *__return_storage_ptr__,
             vector<t_GSA,_std::allocator<t_GSA>_> *gsa_cluster)

{
  pointer puVar1;
  char cVar2;
  uchar uVar3;
  uchar uVar4;
  uint uVar5;
  bool bVar6;
  char cVar7;
  uint64_t uVar8;
  pointer puVar9;
  pointer puVar10;
  pointer pvVar11;
  uchar uVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  pointer paVar17;
  ulong uVar18;
  long lVar19;
  size_t sVar20;
  ulong uVar21;
  uchar *puVar22;
  int c;
  ulong uVar23;
  ulong uVar24;
  pointer puVar25;
  byte bVar26;
  ulong uVar27;
  uchar *puVar28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> all_chars;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  char *local_1a8;
  char *pcStack_1a0;
  char *local_198;
  uchar *local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  vector<candidate_variant,_std::allocator<candidate_variant>_> *local_128;
  ulong local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  uchar *local_e0;
  uchar *local_d8;
  ulong local_d0;
  candidate_variant local_c8;
  uchar *local_58;
  ulong local_50;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = __return_storage_ptr__;
  local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  *local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start[1] = 0;
  local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_48,2,(value_type *)&local_c8,(allocator_type *)&local_1c8);
  if (local_c8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.left_context_idx_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  paVar17 = (gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
      super__Vector_impl_data._M_finish == paVar17) {
    uVar21 = 0;
    uVar24 = 0;
    uVar27 = 0;
  }
  else {
    lVar19 = 0xc;
    uVar24 = 0;
    local_120 = 0;
    uVar21 = 0;
    uVar23 = 0;
    do {
      pvVar11 = local_48.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (ulong)*(uint *)((long)paVar17 + lVar19 + -0xc);
      uVar27 = (ulong)*(uint *)((long)paVar17 + lVar19 + -4);
      if (uVar24 < uVar27) {
        local_120 = uVar18;
        uVar21 = (ulong)*(uint *)((long)paVar17 + lVar19 + -8);
      }
      if (uVar27 < uVar24) {
        uVar27 = uVar24;
      }
      uVar24 = uVar27;
      bVar6 = nr_reads1 <= uVar18;
      iVar13 = base_to_int(*(uchar *)((long)&paVar17->text + lVar19));
      puVar1 = pvVar11[bVar6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + iVar13;
      *puVar1 = *puVar1 + 1;
      uVar23 = uVar23 + 1;
      paVar17 = (gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 0x10;
      uVar27 = local_120;
    } while (uVar23 < (ulong)((long)(gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar17 >> 4)
            );
  }
  if ((ulong)(long)k_right <= uVar24) {
    local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    bVar26 = 0;
    local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    uVar24 = 0;
    local_120 = uVar27;
    do {
      if ((uint)mcov_out <=
          ((local_48.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar24]) {
        uVar12 = (uchar)(0x54474341 >> (bVar26 & 0x1f));
        if (3 < uVar24) {
          uVar12 = 'A';
        }
        local_c8.left_context_idx_0.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_c8.left_context_idx_0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,uVar12);
        if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_c8);
        }
        else {
          *local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar12;
          local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((uint)mcov_out <=
          local_48.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar24]) {
        uVar12 = (uchar)(0x54474341 >> (bVar26 & 0x1f));
        if (3 < uVar24) {
          uVar12 = 'A';
        }
        local_c8.left_context_idx_0.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_c8.left_context_idx_0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,uVar12);
        if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&local_188,
                     (iterator)
                     local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_c8);
        }
        else {
          *local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar12;
          local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar10 = local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar9 = local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar24 = uVar24 + 1;
      bVar26 = bVar26 + 8;
    } while (uVar24 != 4);
    if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar19 = 0x3f;
      if ((long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        for (; (ulong)((long)local_1c8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> lVar19 == 0;
            lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9,puVar10);
    }
    puVar10 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    puVar9 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar19 = 0x3f;
      if ((long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        for (; (ulong)((long)local_188.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_188.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> lVar19 == 0;
            lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9,puVar10);
    }
    local_1a8 = (char *)0x0;
    pcStack_1a0 = (char *)0x0;
    local_198 = (char *)0x0;
    uVar27 = (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (uVar27 == 0) {
      pcVar14 = (char *)0x0;
      sVar20 = 0;
    }
    else {
      if ((long)uVar27 < 0) {
        std::__throw_bad_alloc();
      }
      pcVar14 = (char *)operator_new(uVar27);
      sVar20 = (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    }
    local_198 = pcVar14 + uVar27;
    local_1a8 = pcVar14;
    if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcStack_1a0 = pcVar14;
      memmove(pcVar14,local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,sVar20);
    }
    pcStack_1a0 = pcVar14 + sVar20;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,pcVar14,
               local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    pcVar15 = pcStack_1a0;
    pcVar14 = local_1a8;
    if (local_1a8 != pcStack_1a0) {
      lVar19 = 0x3f;
      if ((long)pcStack_1a0 - (long)local_1a8 != 0) {
        for (; (ulong)((long)pcStack_1a0 - (long)local_1a8) >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1a8,pcStack_1a0,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pcVar14,pcVar15);
      pcVar14 = pcStack_1a0;
      if (local_1a8 != pcStack_1a0) {
        pcVar14 = local_1a8 + 1;
        do {
          pcVar15 = pcVar14;
          pcVar14 = pcStack_1a0;
          if (pcVar15 == pcStack_1a0) goto LAB_001069f6;
          pcVar14 = pcVar15 + 1;
        } while (pcVar15[-1] != *pcVar15);
        pcVar16 = pcVar15 + -1;
        cVar7 = pcVar15[-1];
        for (; pcVar14 != pcStack_1a0; pcVar14 = pcVar14 + 1) {
          cVar2 = *pcVar14;
          if (cVar7 != cVar2) {
            pcVar16[1] = cVar2;
            pcVar16 = pcVar16 + 1;
          }
          cVar7 = cVar2;
        }
        pcVar16 = pcVar16 + 1;
        pcVar14 = pcStack_1a0;
        if (pcVar16 != pcStack_1a0) {
          pcVar14 = pcVar16;
          pcStack_1a0 = pcVar16;
        }
      }
    }
LAB_001069f6:
    local_58 = local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_190 = local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    sVar20 = (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (((((sVar20 != 0) && (sVar20 < 3)) &&
         (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start)) &&
        ((ulong)((long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) < 3)) &&
       (((sVar20 != (long)local_188.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_188.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start ||
         (iVar13 = bcmp(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,sVar20), iVar13 != 0)) &&
        ((ulong)((long)pcVar14 - (long)local_1a8) < 4)))) {
      do {
        local_50 = uVar21;
        if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar12 = *local_190;
          local_e0 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          puVar22 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar28 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            uVar3 = *puVar28;
            if (uVar12 != uVar3) {
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (unsigned_long *)0x0;
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (unsigned_long *)0x0;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              paVar17 = (gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              if ((gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                  super__Vector_impl_data._M_finish != paVar17) {
                lVar19 = 0xc;
                uVar21 = 0;
                local_d8 = puVar28;
                do {
                  uVar8 = nr_reads1;
                  iVar13 = k_left;
                  puVar25 = (pointer)(ulong)*(uint *)((long)paVar17 + lVar19 + -0xc);
                  uVar5 = *(uint *)((long)paVar17 + lVar19 + -8);
                  local_d0 = (ulong)*(uint *)((long)paVar17 + lVar19 + -4);
                  uVar4 = *(uchar *)((long)&paVar17->text + lVar19);
                  uVar24 = (ulong)k_left;
                  uVar27 = (ulong)k_right;
                  if (((uVar24 <= uVar5) && (uVar4 == uVar12)) &&
                     ((puVar25 < nr_reads1 &&
                      ((uVar27 <= local_d0 &&
                       ((ulong)((long)local_148.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) <
                        (ulong)(long)consensus_reads)))))) {
                    if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_c8.left_context_idx_0.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = puVar25;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_148,
                                 (iterator)
                                 local_148.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_c8);
                      iVar13 = k_left;
                    }
                    else {
                      *local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)puVar25;
                      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_148.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                    local_c8.left_context_idx_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)(ulong)(uVar5 - iVar13);
                    if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_f8,
                                 (iterator)
                                 local_f8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_c8);
                      iVar13 = k_left;
                    }
                    else {
                      *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (unsigned_long)
                           local_c8.left_context_idx_0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                    uVar27 = (ulong)k_right;
                    uVar24 = (ulong)iVar13;
                  }
                  if ((((uVar24 <= uVar5) && (uVar4 == uVar3)) && (uVar8 <= puVar25)) &&
                     ((uVar27 <= local_d0 &&
                      ((ulong)((long)local_168.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_168.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) <
                       (ulong)(long)consensus_reads)))) {
                    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_c8.left_context_idx_0.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = puVar25;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_168,
                                 (iterator)
                                 local_168.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_c8);
                      iVar13 = k_left;
                    }
                    else {
                      *local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)puVar25;
                      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_168.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                    local_c8.left_context_idx_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)(ulong)(uVar5 - iVar13);
                    if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_118,
                                 (iterator)
                                 local_118.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_c8);
                    }
                    else {
                      *local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (unsigned_long)
                           local_c8.left_context_idx_0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_118.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  uVar24 = local_50;
                  puVar28 = local_d8;
                  puVar22 = local_e0;
                  uVar27 = local_120;
                  uVar21 = uVar21 + 1;
                  paVar17 = (gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  lVar19 = lVar19 + 0x10;
                } while (uVar21 < (ulong)((long)(gsa_cluster->
                                                super__Vector_base<t_GSA,_std::allocator<t_GSA>_>).
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)paVar17 >> 4));
                if ((local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish !=
                     local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start) &&
                   (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start)) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            (&local_c8.left_context_idx_0,&local_148);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            (&local_c8.left_context_pos_0,&local_f8);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            (&local_c8.left_context_idx_1,&local_168);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            (&local_c8.left_context_pos_1,&local_118);
                  local_c8.right_context_idx = uVar27;
                  local_c8.right_context_pos = uVar24;
                  std::vector<candidate_variant,_std::allocator<candidate_variant>_>::
                  emplace_back<candidate_variant>(local_128,&local_c8);
                  if (local_c8.left_context_pos_1.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_c8.left_context_pos_1.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_c8.left_context_idx_1.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_c8.left_context_idx_1.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_c8.left_context_pos_0.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_c8.left_context_pos_0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_c8.left_context_idx_0.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_c8.left_context_idx_0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
                  operator_delete(local_168.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
                operator_delete(local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
            puVar28 = puVar28 + 1;
          } while (puVar28 != puVar22);
        }
        local_190 = local_190 + 1;
        uVar21 = local_50;
      } while (local_190 != local_58);
    }
    if (local_1a8 != (char *)0x0) {
      operator_delete(local_1a8);
    }
    if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  return local_128;
}

Assistant:

vector<candidate_variant> find_variants(vector<t_GSA> & gsa_cluster){

	vector<candidate_variant>  out;

	auto counts = vector<vector<unsigned int> >(2,vector<unsigned int>(4,0));

	uint64_t max_lcp_val = 0;//value of max LCP in cluster
	uint64_t max_lcp_read_idx = 0;//index of read with max LCP in cluster
	uint64_t max_lcp_read_pos = 0;//position in read where max LCP starts

	for(uint64_t i=0;i<gsa_cluster.size();++i){

		auto e = gsa_cluster[i];

		//find read with max LCP
		if(e.lcp > max_lcp_val){

			max_lcp_val = e.lcp;
			max_lcp_read_idx = e.text;
			max_lcp_read_pos = e.suff;

		}

		bool sample = e.text < nr_reads1 ? 0 : 1;
		counts[sample?1:0][base_to_int(e.bwt)]++;

	}

	//discard cluster if max LCP is less than k_right
	if(max_lcp_val < k_right) return out;

	//compute the lists of frequent characters in indiv 0 and 1
	vector<unsigned char> frequent_char_0;
	vector<unsigned char> frequent_char_1;

	for(int c=0;c<4;++c){

		if(counts[0][c] >= mcov_out) frequent_char_0.push_back(int_to_base(c));
		if(counts[1][c] >= mcov_out) frequent_char_1.push_back(int_to_base(c));

	}

	std::sort(frequent_char_0.begin(), frequent_char_0.end());
	std::sort(frequent_char_1.begin(), frequent_char_1.end());

	//all variations observed in cluster
	auto all_chars = frequent_char_0;
	all_chars.insert(all_chars.begin(), frequent_char_1.begin(), frequent_char_1.end());
	std::sort( all_chars.begin(), all_chars.end() );
	all_chars.erase(std::unique( all_chars.begin(), all_chars.end() ), all_chars.end());

	//filter: remove clusters that cannot reflect a variation
	if(	frequent_char_0.size()==0 or // not covered enough
		frequent_char_1.size()==0 or // not covered enough
		frequent_char_0.size()>2 or // we require at most 2 alleles per individual
		frequent_char_1.size()>2 or // we require  at most 2 alleles per individual
		frequent_char_0 == frequent_char_1 or // same alleles: probably both heterozigous / multiple region (and no variants)
		all_chars.size() > 3	//4 or more distinct frequent characters in the cluster (probably multiple region)
	){

		return out;

	}

	for(auto c0 : frequent_char_0){

		for(auto c1 : frequent_char_1){

			if(c0 != c1){

				//compute max length of left context in indiv. 0 and 1, on the reads whose left
				//contexts end with c0 and c1, respectively.

				vector<uint64_t> left_pos_0;
				vector<uint64_t> left_idx_0;

				vector<uint64_t> left_pos_1;
				vector<uint64_t> left_idx_1;

				for(uint64_t i=0;i<gsa_cluster.size();++i){

					auto e = gsa_cluster[i];
					bool sample = e.text < nr_reads1 ? 0 : 1;
					uint64_t prefix_len = e.suff;
					unsigned char ch = e.bwt;
					uint64_t lcp = e.lcp;

					if(	prefix_len >= k_left and
						ch == c0 and
						sample == 0 and
						lcp >= k_right and //TODO test
						left_idx_0.size()<consensus_reads){

						left_idx_0.push_back(e.text);
						left_pos_0.push_back(e.suff-k_left);

					}

					if(	prefix_len >= k_left and
						ch == c1 and
						sample == 1 and
						lcp >= k_right and //TODO test
						left_idx_1.size()<consensus_reads){

						left_idx_1.push_back(e.text);
						left_pos_1.push_back(e.suff-k_left);

					}

				}

				if(left_idx_0.size()>0 and left_idx_1.size()>0){

					out.push_back(
						{

							left_idx_0, left_pos_0,
							left_idx_1, left_pos_1,
							max_lcp_read_idx, max_lcp_read_pos

						}
					);

				}

			}

		}

	}

	return out;

}